

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O3

void lace_resume(void)

{
  uint uVar1;
  
  do {
  } while (lace_awaken_count < 0);
  if (lace_awaken_count == 0) {
    LOCK();
    lace_awaken_count = -1;
    UNLOCK();
    if (n_workers != 0) {
      uVar1 = 0;
      do {
        sem_post((sem_t *)&suspend_semaphore);
        uVar1 = uVar1 + 1;
      } while (uVar1 < n_workers);
    }
    lace_awaken_count = 1;
  }
  else {
    lace_awaken_count = lace_awaken_count + 1;
    LOCK();
    UNLOCK();
  }
  return;
}

Assistant:

void
lace_resume()
{
    while (1) {
        int state = atomic_load_explicit(&lace_awaken_count, memory_order_consume);
        if (state < 0) {
            continue; // wait until suspending is done
        } else if (state == 0) {
            int next = -1; // intermediate state
            if (atomic_compare_exchange_weak(&lace_awaken_count, &state, next) == 1) {
                for (unsigned int i=0; i<n_workers; i++) sem_post(&suspend_semaphore);
                atomic_store_explicit(&lace_awaken_count, 1, memory_order_release);
                break;
            }
        } else {
            int next = state + 1;
            if (atomic_compare_exchange_weak(&lace_awaken_count, &state, next) == 1) break;
        }
    }
}